

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O2

llb_build_value_file_info_t *
llb_buildsystem_command_interface_get_file_info
          (llb_build_value_file_info_t *__return_storage_ptr__,llb_buildsystem_interface_t *bi_p,
          char *path)

{
  FileSystem *pFVar1;
  allocator local_91;
  string local_90 [32];
  FileInfo local_70;
  
  pFVar1 = llbuild::buildsystem::BuildSystem::getFileSystem((BuildSystem *)bi_p);
  std::__cxx11::string::string(local_90,path,&local_91);
  (*pFVar1->_vptr_FileSystem[7])(&local_70,pFVar1,local_90);
  llbuild::capi::convertFileInfo(&local_70);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

llb_build_value_file_info_t llb_buildsystem_command_interface_get_file_info(llb_buildsystem_interface_t* bi_p, const char* path) {
  auto bi = (BuildSystem*)bi_p;
  return llbuild::capi::convertFileInfo(bi->getFileSystem().getFileInfo(path));
}